

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Roller.cxx
# Opt level: O1

void __thiscall Fl_Roller::draw(Fl_Roller *this)

{
  byte bVar1;
  int iVar2;
  _func_int *p_Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar13;
  int iVar14;
  uint uVar16;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double junk;
  double local_38;
  ulong uVar12;
  ulong uVar15;
  ulong uVar17;
  
  if ((char)(this->super_Fl_Valuator).super_Fl_Widget.damage_ < '\0') {
    Fl_Widget::draw_box((Fl_Widget *)this);
  }
  iVar8 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
  iVar4 = Fl::box_dx((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar14 = (this->super_Fl_Valuator).super_Fl_Widget.y_;
  iVar5 = Fl::box_dy((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
  uVar6 = Fl::box_dw((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  uVar9 = ~uVar6 + iVar2;
  uVar12 = (ulong)uVar9;
  iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.h_;
  uVar6 = Fl::box_dh((uint)(this->super_Fl_Valuator).super_Fl_Widget.box_);
  if (0 < (int)uVar9) {
    uVar6 = iVar2 + ~uVar6;
    uVar18 = (ulong)uVar6;
    if (0 < (int)uVar6) {
      dVar19 = (this->super_Fl_Valuator).A / (double)(this->super_Fl_Valuator).B;
      dVar20 = 0.0;
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        dVar20 = (double)(int)((this->super_Fl_Valuator).value_ / dVar19) * 0.9974949866040544;
      }
      uVar16 = iVar4 + iVar8;
      uVar17 = (ulong)uVar16;
      uVar13 = iVar5 + iVar14;
      uVar15 = (ulong)uVar13;
      bVar1 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                (fl_graphics_driver,(ulong)(this->super_Fl_Valuator).super_Fl_Widget.color_);
      p_Var3 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4];
      if ((bVar1 & 1) == 0) {
        uVar11 = uVar6 >> 2;
        (*p_Var3)(fl_graphics_driver,uVar17,(ulong)(uVar11 + uVar13 + 1),uVar12,
                  (ulong)(uVar6 - (uVar11 * 2 + 2)));
        uVar7 = uVar6 + uVar13;
        uVar10 = 0x30;
        iVar8 = uVar11 + 1;
        do {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)uVar10);
          iVar14 = 0;
          if (0x27 < uVar10) {
            iVar14 = (int)((ulong)(uint)(iVar8 * 2) * 0x55555556 >> 0x20) + 1;
          }
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,uVar17,(ulong)(iVar14 + uVar13),uVar12,
                     (ulong)(uint)(iVar8 - iVar14));
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,uVar17,(ulong)(uVar7 - iVar8),uVar12,
                     (ulong)(uint)(iVar8 - iVar14));
          uVar10 = uVar10 - 1;
          iVar8 = iVar14;
        } while (iVar14 != 0);
        iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
        if (iVar8 != 0) {
          dVar20 = modf((dVar20 / (double)(uVar6 >> 1)) / 0.2,&local_38);
          dVar20 = dVar20 * 0.2 + -1.5;
          uVar11 = (uVar9 + uVar16) - 1;
          while( true ) {
            dVar19 = sin(dVar20);
            iVar8 = (int)((dVar19 / 0.9974949866040544 + 1.0) * (double)(int)uVar6 * 0.5);
            if (iVar8 < 1) {
              iVar14 = 0xd;
            }
            else {
              iVar14 = 0xb;
              if (iVar8 < (int)(uVar6 - 1)) {
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                          (fl_graphics_driver,0x27);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                          (fl_graphics_driver,(ulong)(uVar16 + 1),(ulong)(iVar8 + uVar13),
                           (ulong)uVar11);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                          (fl_graphics_driver,0x32);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                          (fl_graphics_driver,(ulong)(uVar16 + 1),
                           (ulong)((iVar8 + uVar13 + (uint)(0.0 <= dVar20) * 2) - 1),(ulong)uVar11);
                iVar14 = 0;
              }
            }
            if ((iVar14 != 0xd) && (iVar14 != 0)) break;
            dVar20 = dVar20 + 0.2;
          }
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x2d);
          uVar11 = uVar9 + uVar16;
          uVar13 = (uVar6 >> 3) + uVar13 + 1;
          uVar6 = uVar7 - ((uVar6 >> 3) + 1);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,(ulong)((uVar9 + uVar16) - 1),(ulong)uVar13,(ulong)uVar6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[7])
                    (fl_graphics_driver,(ulong)uVar11,uVar15,uVar17,(ulong)uVar13);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,uVar17,(ulong)uVar6,(ulong)uVar7);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x34);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,uVar17,(ulong)uVar13,(ulong)uVar6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[7])
                    (fl_graphics_driver,uVar17,(ulong)uVar7,(ulong)uVar11,(ulong)uVar6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                    (fl_graphics_driver,(ulong)uVar11,(ulong)uVar13,uVar15);
        }
      }
      else {
        uVar11 = uVar9 >> 2;
        (*p_Var3)(fl_graphics_driver,(ulong)(uVar11 + uVar16 + 1),uVar15,
                  (ulong)(uVar9 - (uVar11 * 2 + 2)),uVar18);
        uVar7 = uVar9 + uVar16;
        uVar10 = 0x30;
        iVar8 = uVar11 + 1;
        do {
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)uVar10);
          iVar14 = 0;
          if (0x27 < uVar10) {
            iVar14 = (int)((ulong)(uint)(iVar8 * 2) * 0x55555556 >> 0x20) + 1;
          }
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,(ulong)(iVar14 + uVar16),uVar15,
                     (ulong)(uint)(iVar8 - iVar14),uVar18);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                    (fl_graphics_driver,(ulong)(uVar7 - iVar8),uVar15,(ulong)(uint)(iVar8 - iVar14),
                     uVar18);
          uVar10 = uVar10 - 1;
          iVar8 = iVar14;
        } while (iVar14 != 0);
        iVar8 = Fl_Widget::active_r((Fl_Widget *)this);
        if (iVar8 != 0) {
          dVar20 = modf((dVar20 / (double)(uVar9 >> 1)) / 0.2,&local_38);
          dVar20 = dVar20 * 0.2 + -1.5;
          uVar11 = (uVar6 + uVar13) - 1;
          while( true ) {
            dVar19 = sin(dVar20);
            iVar8 = (int)((dVar19 / 0.9974949866040544 + 1.0) * (double)(int)uVar9 * 0.5);
            if (iVar8 < 1) {
              iVar14 = 7;
            }
            else {
              iVar14 = 5;
              if (iVar8 < (int)(uVar9 - 1)) {
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                          (fl_graphics_driver,0x27);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                          (fl_graphics_driver,(ulong)(iVar8 + uVar16),(ulong)(uVar13 + 1),
                           (ulong)uVar11);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                          (fl_graphics_driver,0x32);
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                          (fl_graphics_driver,
                           (ulong)((iVar8 + uVar16 + (uint)(0.0 <= dVar20) * 2) - 1),
                           (ulong)(uVar13 + 1),(ulong)uVar11);
                iVar14 = 0;
              }
            }
            if ((iVar14 != 7) && (iVar14 != 0)) break;
            dVar20 = dVar20 + 0.2;
          }
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x2d);
          uVar16 = (uVar9 >> 3) + uVar16 + 1;
          uVar11 = uVar6 + uVar13;
          uVar9 = uVar7 - ((uVar9 >> 3) + 1);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)uVar16,(ulong)((uVar6 + uVar13) - 1),(ulong)uVar9);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[10])
                    (fl_graphics_driver,uVar17,(ulong)uVar11,uVar15,(ulong)uVar16);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)uVar9,uVar15,(ulong)uVar7);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x34);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)uVar16,(ulong)(uVar13 - 1),(ulong)uVar9);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[10])
                    (fl_graphics_driver,(ulong)uVar7,uVar15,(ulong)uVar11,(ulong)uVar9);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                    (fl_graphics_driver,(ulong)uVar16,(ulong)uVar11,uVar17);
        }
      }
      if (Fl::focus_ == (Fl_Widget *)this) {
        Fl_Widget::draw_focus
                  ((Fl_Widget *)this,FL_THIN_UP_FRAME,(this->super_Fl_Valuator).super_Fl_Widget.x_,
                   (this->super_Fl_Valuator).super_Fl_Widget.y_,
                   (this->super_Fl_Valuator).super_Fl_Widget.w_,
                   (this->super_Fl_Valuator).super_Fl_Widget.h_);
        return;
      }
    }
  }
  return;
}

Assistant:

void Fl_Roller::draw() {
  if (damage()&FL_DAMAGE_ALL) draw_box();
  int X = x()+Fl::box_dx(box());
  int Y = y()+Fl::box_dy(box());
  int W = w()-Fl::box_dw(box())-1;
  int H = h()-Fl::box_dh(box())-1;
  if (W<=0 || H <=0) return;
  int offset = step() ? int(value()/step()) : 0;
  const double ARC = 1.5; // 1/2 the number of radians visible
  const double delta = .2; // radians per knurl
  if (horizontal()) { // horizontal one
    // draw shaded ends of wheel:
    int h1 = W/4+1; // distance from end that shading starts
    fl_color(color()); fl_rectf(X+h1,Y,W-2*h1,H);
    for (int i=0; h1; i++) {
      fl_color((Fl_Color)(FL_GRAY-i-1));
      int h2 = FL_GRAY-i-1 > FL_DARK3 ? 2*h1/3+1 : 0;
      fl_rectf(X+h2,Y,h1-h2,H);
      fl_rectf(X+W-h1,Y,h1-h2,H);
      h1 = h2;
    }
    if (active_r()) {
      // draw ridges:
      double junk;
      for (double yy = -ARC+modf(offset*sin(ARC)/(W/2)/delta,&junk)*delta;;
	   yy += delta) {
	int yy1 = int((sin(yy)/sin(ARC)+1)*W/2);
	if (yy1 <= 0) continue; else if (yy1 >= W-1) break;
	fl_color(FL_DARK3); fl_yxline(X+yy1,Y+1,Y+H-1);
	if (yy < 0) yy1--; else yy1++;
	fl_color(FL_LIGHT1);fl_yxline(X+yy1,Y+1,Y+H-1);
      }
      // draw edges:
      h1 = W/8+1; // distance from end the color inverts
      fl_color(FL_DARK2);
      fl_xyline(X+h1,Y+H-1,X+W-h1);
      fl_color(FL_DARK3);
      fl_yxline(X,Y+H,Y,X+h1);
      fl_xyline(X+W-h1,Y,X+W);
      fl_color(FL_LIGHT2);
      fl_xyline(X+h1,Y-1,X+W-h1);
      fl_yxline(X+W,Y,Y+H,X+W-h1);
      fl_xyline(X+h1,Y+H,X);
    }
  } else { // vertical one
    // draw shaded ends of wheel:
    int h1 = H/4+1; // distance from end that shading starts
    fl_color(color()); fl_rectf(X,Y+h1,W,H-2*h1);
    for (int i=0; h1; i++) {
      fl_color((Fl_Color)(FL_GRAY-i-1));
      int h2 = FL_GRAY-i-1 > FL_DARK3 ? 2*h1/3+1 : 0;
      fl_rectf(X,Y+h2,W,h1-h2);
      fl_rectf(X,Y+H-h1,W,h1-h2);
      h1 = h2;
    }
    if (active_r()) {
      // draw ridges:
      double junk;
      for (double yy = -ARC+modf(offset*sin(ARC)/(H/2)/delta,&junk)*delta;
	   ; yy += delta) {
	int yy1 = int((sin(yy)/sin(ARC)+1)*H/2);
	if (yy1 <= 0) continue; else if (yy1 >= H-1) break;
	fl_color(FL_DARK3); fl_xyline(X+1,Y+yy1,X+W-1);
	if (yy < 0) yy1--; else yy1++;
	fl_color(FL_LIGHT1);fl_xyline(X+1,Y+yy1,X+W-1);
      }
      // draw edges:
      h1 = H/8+1; // distance from end the color inverts
      fl_color(FL_DARK2);
      fl_yxline(X+W-1,Y+h1,Y+H-h1);
      fl_color(FL_DARK3);
      fl_xyline(X+W,Y,X,Y+h1);
      fl_yxline(X,Y+H-h1,Y+H);
      fl_color(FL_LIGHT2);
      fl_yxline(X,Y+h1,Y+H-h1);
      fl_xyline(X,Y+H,X+W,Y+H-h1);
      fl_yxline(X+W,Y+h1,Y);
    }
  }

  if (Fl::focus() == this) draw_focus(FL_THIN_UP_FRAME, x(), y(), w(), h());
}